

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexSeparableKernel::flipV(PtexSeparableKernel *this)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  
  iVar2 = this->vw;
  this->v = (1 << ((this->res).vlog2 & 0x1fU)) - (this->v + iVar2);
  pfVar3 = this->kv;
  pfVar5 = pfVar3 + (long)iVar2 + -1;
  if (pfVar3 < pfVar5 && iVar2 != 0) {
    do {
      pfVar4 = pfVar3 + 1;
      fVar1 = *pfVar3;
      *pfVar3 = *pfVar5;
      *pfVar5 = fVar1;
      pfVar5 = pfVar5 + -1;
      pfVar3 = pfVar4;
    } while (pfVar4 < pfVar5);
  }
  return;
}

Assistant:

int v() const { return 1<<(unsigned)vlog2; }